

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_minimum_phase_impulse_response.cc
# Opt level: O3

bool __thiscall
sptk::CepstrumToMinimumPhaseImpulseResponse::Run
          (CepstrumToMinimumPhaseImpulseResponse *this,
          vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *minimum_phase_impulse_response)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type __new_size;
  long lVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double dVar12;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar3 = false;
  if ((minimum_phase_impulse_response != (vector<double,_std::allocator<double>_> *)0x0) &&
     (pdVar10 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start, bVar3 = false,
     (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish - (long)pdVar10 >> 3 ==
     (long)this->num_input_order_ + 1)) {
    pdVar11 = (minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start;
    __new_size = (long)this->num_output_order_ + 1;
    if ((long)(minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar11 >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize
                (minimum_phase_impulse_response,__new_size);
      pdVar10 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar11 = (minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    dVar12 = exp(*pdVar10);
    *pdVar11 = dVar12;
    uVar1 = this->num_output_order_;
    bVar3 = true;
    if (0 < (int)uVar1) {
      iVar2 = this->num_input_order_;
      lVar5 = 1;
      pdVar6 = pdVar11;
      do {
        iVar4 = (int)lVar5;
        iVar7 = iVar4;
        if (iVar2 < iVar4) {
          iVar7 = iVar2;
        }
        if (iVar2 < 1) {
          dVar12 = 0.0;
        }
        else {
          dVar12 = 0.0;
          uVar8 = 1;
          pdVar9 = pdVar6;
          do {
            dVar12 = dVar12 + (double)(int)uVar8 * pdVar10[uVar8] * *pdVar9;
            uVar8 = uVar8 + 1;
            pdVar9 = pdVar9 + -1;
          } while (iVar7 + 1 != uVar8);
        }
        pdVar11[lVar5] = dVar12 / (double)iVar4;
        lVar5 = lVar5 + 1;
        pdVar6 = pdVar6 + 1;
      } while (lVar5 != (ulong)uVar1 + 1);
    }
  }
  return bVar3;
}

Assistant:

bool CepstrumToMinimumPhaseImpulseResponse::Run(
    const std::vector<double>& cepstrum,
    std::vector<double>* minimum_phase_impulse_response) const {
  // Check inputs.
  if (!is_valid_ ||
      cepstrum.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == minimum_phase_impulse_response) {
    return false;
  }

  // Prepare memories.
  if (minimum_phase_impulse_response->size() !=
      static_cast<std::size_t>(num_output_order_ + 1)) {
    minimum_phase_impulse_response->resize(num_output_order_ + 1);
  }

  const double* c(&cepstrum[0]);
  double* h(&((*minimum_phase_impulse_response)[0]));

  h[0] = std::exp(c[0]);
  for (int n(1); n <= num_output_order_; ++n) {
    double sum(0.0);
    const int end((num_input_order_ < n) ? num_input_order_ : n);
    for (int k(1); k <= end; ++k) {
      sum += k * c[k] * h[n - k];
    }
    h[n] = sum / n;
  }

  return true;
}